

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  unsigned_short ***pppuVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  iterator iVar6;
  BasicImageIO *pBVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *pIVar17;
  long lVar18;
  int d;
  ulong uVar19;
  long lVar20;
  size_t __n;
  long lVar21;
  float *pfVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int depth;
  uint local_26c;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  char *local_230;
  long local_228;
  long local_220;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_218;
  long local_210;
  long theight;
  long twidth;
  ImageIO *local_1f8;
  long local_1f0;
  BasicImageIO *local_1e8;
  long local_1e0;
  long tborder;
  long local_1d0;
  long local_1c8;
  valarray<float> value;
  valarray<float> count;
  string tname;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> timage;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  
  local_26c = ds;
  local_260 = x;
  local_250 = y;
  local_230 = name;
  local_1f8 = this;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar5 = std::__cxx11::string::rfind((char)&s,0x3a);
  if (uVar5 != 0xffffffffffffffff) {
    iVar4 = std::__cxx11::string::compare((ulong)&s,uVar5,(char *)0x2);
    pcVar3 = local_230;
    if (iVar4 != 0) {
      local_1e8 = getBasicImageIO(local_1f8,local_230,true);
      std::__cxx11::string::string((string *)&s_1,pcVar3,(allocator *)&timage);
      uVar5 = std::__cxx11::string::rfind((char)&s_1,0x3a);
      if (uVar5 != 0xffffffffffffffff) {
        std::__cxx11::string::compare((ulong)&s_1,uVar5,(char *)0x2);
      }
      std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
      std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &list._M_t._M_impl.super__Rb_tree_header._M_header;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      anon_unknown_17::loadTiledHeader
                (local_1e8,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
      lVar14 = tborder;
      local_268 = (long)(int)local_26c;
      if (w < 1) {
        w = (width + local_268 + -1) / local_268;
      }
      if (h < 1) {
        h = (height + local_268 + -1) / local_268;
      }
      lVar23 = twidth + tborder * -2;
      lVar21 = theight + tborder * -2;
      local_1f0 = lVar21;
      local_1e0 = lVar23;
      if (tborder == 0 && local_26c == 1) {
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(image,w,h,(long)depth);
        local_248 = w + local_260;
        local_228 = h + local_250;
        lVar24 = local_228 + -1;
        lVar14 = local_248 + -1;
        lVar20 = 0;
        if (0 < local_260) {
          lVar20 = local_260;
        }
        lVar16 = 0;
        if (0 < local_250) {
          lVar16 = local_250;
        }
        lVar11 = image->n;
        lVar12 = -lVar11;
        if (0 < lVar11) {
          lVar12 = lVar11;
        }
        memset(image->pixel,0,lVar12 * 2);
        local_240 = (long)(int)(lVar20 / lVar23);
        local_238 = (long)(int)(lVar14 / lVar23);
        local_220 = (long)(int)(lVar24 / lVar21);
        pIVar17 = (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                  (long)(int)(lVar16 / lVar21);
        lVar14 = local_1e0;
        lVar21 = local_248;
        while ((long)pIVar17 <= local_220) {
          local_268 = local_250 - (long)pIVar17 * local_1f0;
          if (local_268 < 1) {
            local_268 = 0;
          }
          lVar24 = (long)pIVar17 * local_1f0 + local_268;
          local_210 = local_228 - lVar24;
          lVar24 = lVar24 - local_250;
          lVar23 = local_240;
          local_218 = pIVar17;
          while (lVar23 <= local_238) {
            lVar20 = local_260 - lVar23 * lVar14;
            if (lVar20 < 1) {
              lVar20 = 0;
            }
            lVar14 = lVar23 * lVar14 + lVar20;
            lVar21 = lVar21 - lVar14;
            if (twidth - lVar20 <= lVar21) {
              lVar21 = twidth - lVar20;
            }
            lVar16 = theight - local_268;
            if (local_210 < theight - local_268) {
              lVar16 = local_210;
            }
            local_258 = lVar23;
            anon_unknown_17::getTileName(&tname,&prefix,(int)local_218,(int)lVar23,&suffix);
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
                      (&timage,lVar21,lVar16,depth);
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&list._M_t,&tname);
            if ((_Rb_tree_header *)iVar6._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
              (*local_1e8->_vptr_BasicImageIO[7])
                        (local_1e8,&timage,tname._M_dataplus._M_p,1,lVar20,local_268,lVar21,lVar16);
              lVar21 = timage.width;
              if (timage.width < 1) {
                lVar21 = 0;
              }
              lVar23 = timage.height;
              if (timage.height < 1) {
                lVar23 = 0;
              }
              for (lVar20 = 0; lVar20 != lVar23; lVar20 = lVar20 + 1) {
                uVar5 = (ulong)(uint)depth;
                if (depth < 1) {
                  uVar5 = 0;
                }
                for (lVar16 = 0; lVar16 != lVar21; lVar16 = lVar16 + 1) {
                  pppuVar1 = image->img;
                  for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
                    pppuVar1[uVar19][lVar24 + lVar20][(lVar14 - local_260) + lVar16] =
                         timage.img[uVar19][lVar20][lVar16];
                  }
                }
              }
            }
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(&timage);
            std::__cxx11::string::~string((string *)&tname);
            lVar14 = local_1e0;
            lVar21 = local_248;
            lVar23 = local_258 + 1;
          }
          pIVar17 = (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                    ((long)&local_218->depth + 1);
        }
      }
      else {
        local_1c8 = local_268 * local_260;
        local_258 = 0;
        if (0 < local_1c8 - tborder) {
          local_258 = local_1c8 - tborder;
        }
        local_258 = local_258 / lVar23;
        lVar20 = (w + local_260 + -1) * local_268 + tborder;
        lVar16 = (local_250 + h + -1) * local_268 + tborder;
        __n = h * w;
        local_248 = w;
        local_228 = h;
        std::valarray<float>::valarray(&value,(long)depth * __n);
        std::valarray<float>::valarray(&count,__n);
        local_1d0 = local_268 * local_250;
        lVar24 = local_1d0 - lVar14;
        if (local_1d0 - lVar14 < 1) {
          lVar24 = 0;
        }
        lVar18 = (local_248 + local_260) * local_268;
        lVar11 = (local_228 + local_250) * local_268;
        lVar12 = (long)(int)local_258;
        local_258 = local_248 * 4;
        lVar14 = local_248;
        local_218 = image;
        for (lVar24 = (long)(int)(lVar24 / local_1f0); lVar13 = local_228,
            lVar24 <= (int)(lVar16 / lVar21); lVar24 = lVar24 + 1) {
          lVar8 = lVar24 * local_1f0;
          lVar9 = lVar8 - local_1d0;
          for (lVar13 = lVar12; lVar13 <= (int)(lVar20 / lVar23); lVar13 = lVar13 + 1) {
            local_220 = lVar13 * local_1e0;
            local_210 = (tborder - local_220) + local_1c8;
            if (local_210 < 1) {
              local_210 = 0;
            }
            lVar27 = tborder - lVar8;
            lVar25 = lVar27 + local_1d0;
            if (lVar25 < 1) {
              lVar25 = 0;
            }
            lVar15 = ((tborder - local_220) + lVar18) - local_210;
            if (twidth - local_210 <= lVar15) {
              lVar15 = twidth - local_210;
            }
            lVar27 = (lVar27 + lVar11) - lVar25;
            if (theight - lVar25 <= lVar27) {
              lVar27 = theight - lVar25;
            }
            anon_unknown_17::getTileName(&tname,&prefix,(int)lVar24,(int)lVar13,&suffix);
            local_240 = lVar15;
            local_238 = lVar27;
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
                      (&timage,lVar15,lVar27,depth);
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&list._M_t,&tname);
            lVar27 = local_210;
            if ((_Rb_tree_header *)iVar6._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
              (*local_1e8->_vptr_BasicImageIO[7])
                        (local_1e8,&timage,tname._M_dataplus._M_p,1,local_210,lVar25,local_240,
                         local_238);
              lVar15 = timage.width;
              if (timage.width < 1) {
                lVar15 = 0;
              }
              local_240 = timage.height;
              if (timage.height < 1) {
                local_240 = 0;
              }
              local_220 = local_220 + lVar27;
              for (lVar27 = 0; lVar27 != local_240; lVar27 = lVar27 + 1) {
                fVar28 = (float)tborder + (float)tborder;
                local_238 = twidth;
                fVar30 = (float)(lVar27 + lVar25) / fVar28;
                fVar29 = (float)(theight - (lVar27 + lVar25)) / fVar28;
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                if (1.0 <= fVar29) {
                  fVar29 = 1.0;
                }
                if (fVar29 <= 1e-06) {
                  fVar29 = 1e-06;
                }
                uVar2 = depth;
                if (depth < 1) {
                  uVar2 = 0;
                }
                for (lVar26 = 0; lVar26 != lVar15; lVar26 = lVar26 + 1) {
                  lVar14 = (lVar26 + (local_220 - (local_1c8 + tborder))) / local_268;
                  lVar10 = ((lVar9 + lVar25 + lVar27) - tborder) / local_268;
                  if (tborder < 1) {
                    pfVar22 = (float *)(local_258 * lVar10 + lVar14 * 4 + (long)value._M_data);
                    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
                      *pfVar22 = (float)timage.img[uVar5][lVar27][lVar26] + *pfVar22;
                      pfVar22 = pfVar22 + __n;
                    }
                    pfVar22 = count._M_data + lVar10 * local_248;
                    fVar30 = pfVar22[lVar14] + 1.0;
                  }
                  else {
                    fVar31 = (float)(local_210 + lVar26) / fVar28;
                    fVar30 = (float)(twidth - (local_210 + lVar26)) / fVar28;
                    if (fVar31 <= fVar30) {
                      fVar30 = fVar31;
                    }
                    if (1.0 <= fVar30) {
                      fVar30 = 1.0;
                    }
                    if (fVar30 <= 1e-06) {
                      fVar30 = 1e-06;
                    }
                    pfVar22 = (float *)(local_258 * lVar10 + lVar14 * 4 + (long)value._M_data);
                    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
                      *pfVar22 = (float)timage.img[uVar5][lVar27][lVar26] * fVar30 * fVar29 +
                                 *pfVar22;
                      pfVar22 = pfVar22 + __n;
                    }
                    pfVar22 = count._M_data + lVar10 * local_248;
                    fVar30 = fVar30 * fVar29 + pfVar22[lVar14];
                  }
                  pfVar22[lVar14] = fVar30;
                  lVar14 = local_248;
                }
                image = local_218;
              }
            }
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(&timage);
            std::__cxx11::string::~string((string *)&tname);
          }
        }
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
                  (image,lVar14,local_228,(long)depth);
        lVar21 = image->n;
        lVar23 = -lVar21;
        if (0 < lVar21) {
          lVar23 = lVar21;
        }
        memset(image->pixel,0,lVar23 * 2);
        lVar21 = 0;
        if (0 < lVar14) {
          lVar21 = lVar14;
        }
        if (lVar13 < 1) {
          lVar13 = 0;
        }
        lVar23 = 0;
        for (lVar24 = 0; lVar24 != lVar13; lVar24 = lVar24 + 1) {
          uVar5 = (ulong)(uint)depth;
          if (depth < 1) {
            uVar5 = 0;
          }
          lVar20 = lVar23;
          for (lVar16 = 0; lVar16 != lVar21; lVar16 = lVar16 + 1) {
            fVar29 = count._M_data[lVar24 * lVar14 + lVar16];
            if (0.0 < fVar29) {
              pppuVar1 = image->img;
              pfVar22 = (float *)((long)value._M_data + lVar20);
              for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
                pppuVar1[uVar19][lVar24][lVar16] = (unsigned_short)(int)(*pfVar22 / fVar29);
                pfVar22 = pfVar22 + __n;
                image = local_218;
              }
            }
            lVar20 = lVar20 + 4;
          }
          lVar23 = lVar23 + local_258;
        }
        operator_delete(count._M_data);
        operator_delete(value._M_data);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&list._M_t);
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&s_1);
      goto LAB_001159ef;
    }
  }
  pBVar7 = getBasicImageIO(local_1f8,local_230,true);
  (*pBVar7->_vptr_BasicImageIO[7])(pBVar7,image,local_230,(ulong)local_26c,local_260,local_250,w,h);
LAB_001159ef:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void ImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}